

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

Result<wasm::Type> *
wasm::WATParser::reftype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::Type> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  string local_b0 [32];
  string local_90;
  undefined1 local_70 [8];
  MaybeResult<wasm::Type> _val;
  MaybeResult<wasm::Type> t;
  
  maybeReftype<wasm::WATParser::ParseModuleTypesCtx>
            ((MaybeResult<wasm::Type> *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),ctx);
  if (t.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"expected reftype",(allocator<char> *)local_70);
    Lexer::err((Err *)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20),
               &ctx->in,&local_90);
    std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_70,
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                    ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
    if (_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string(local_b0,(string *)local_70);
      std::__detail::__variant::_Variant_storage<false,wasm::Type,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Type,wasm::Err> *)__return_storage_ptr__,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_70);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)local_70);
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err> =
           _val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::None,_wasm::Err>._32_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::None,_wasm::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::None,_wasm::Err> + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeT> reftype(Ctx& ctx) {
  if (auto t = maybeReftype(ctx)) {
    CHECK_ERR(t);
    return *t;
  }
  return ctx.in.err("expected reftype");
}